

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

STAmount * jbcoin::amountFromString(STAmount *__return_storage_ptr__,Issue *issue,string *amount)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  const_reference pvVar10;
  const_reference m2;
  unsigned_long uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long *plVar13;
  size_type *psVar14;
  long lVar15;
  long lVar16;
  smatch match;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined8 local_158;
  uint32_t auStack_150 [2];
  uint32_t local_148 [2];
  mantissa_type local_140;
  exponent_type local_138;
  bool local_133;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  unsigned_long local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((amountFromString(jbcoin::Issue_const&,std::__cxx11::string_const&)::reNumber == '\0') &&
     (iVar8 = __cxa_guard_acquire(&amountFromString(jbcoin::Issue_const&,std::__cxx11::string_const&)
                                   ::reNumber), iVar8 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&amountFromString::reNumber,
                "^([-+]?)(0|[1-9][0-9]*)(\\.([0-9]+))?([eE]([+-]?)([0-9]+))?$",0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&amountFromString::reNumber,&__dso_handle);
    __cxa_guard_release(&amountFromString(jbcoin::Issue_const&,std::__cxx11::string_const&)::
                         reNumber);
  }
  local_e8.m_null.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  local_e8.m_null.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  local_e8.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_base._M_current = (char *)0x0;
  local_e8.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.m_null.matched = false;
  local_e8.m_named_subs.px = (element_type *)0x0;
  local_e8.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
  local_e8.m_last_closed_paren = 0;
  local_e8.m_is_singular = true;
  first._M_current = (amount->_M_dataplus)._M_p;
  bVar7 = boost::
          regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                    (first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(first._M_current + amount->_M_string_length),&local_e8,
                     &amountFromString::reNumber,format_default);
  if (!bVar7) {
    std::operator+(&local_108,"Number \'",amount);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_178._0_8_ = *plVar13;
    psVar14 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_178._0_8_ == psVar14) {
      local_168._M_allocated_capacity = *psVar14;
      local_168._8_8_ = plVar13[3];
      local_178._0_8_ = local_178 + 0x10;
    }
    else {
      local_168._M_allocated_capacity = *psVar14;
    }
    local_178._8_8_ = plVar13[1];
    *plVar13 = (long)psVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    Throw<std::runtime_error,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  }
  pvVar10 = boost::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&local_e8,2);
  bVar7 = pvVar10->matched;
  pcVar1 = (pvVar10->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
  pcVar2 = (pvVar10->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
  pvVar10 = boost::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&local_e8,4);
  lVar16 = (long)pcVar2 - (long)pcVar1;
  if (bVar7 == false) {
    lVar16 = 0;
  }
  lVar15 = (long)(pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current -
           (long)(pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
  if (pvVar10->matched == false) {
    lVar15 = 0;
  }
  if (0x20 < lVar15 + lVar16) {
    std::operator+(&local_108,"Number \'",amount);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_178._0_8_ = *plVar13;
    psVar14 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_178._0_8_ == psVar14) {
      local_168._M_allocated_capacity = *psVar14;
      local_168._8_8_ = plVar13[3];
      local_178._0_8_ = local_178 + 0x10;
    }
    else {
      local_168._M_allocated_capacity = *psVar14;
    }
    local_178._8_8_ = plVar13[1];
    *plVar13 = (long)psVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    Throw<std::runtime_error,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  }
  pvVar10 = boost::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&local_e8,1);
  if (pvVar10->matched == true) {
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,1);
    boost::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,pvVar10);
    iVar8 = std::__cxx11::string::compare(local_178);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
    }
    bVar7 = iVar8 == 0;
  }
  else {
    bVar7 = false;
  }
  local_178._8_8_ = sfGeneric;
  local_178._0_8_ = &PTR__STBase_002d2fc0;
  local_168._M_allocated_capacity = *(undefined8 *)(issue->currency).pn;
  local_168._8_8_ = *(undefined8 *)((issue->currency).pn + 2);
  local_158 = *(undefined8 *)((issue->currency).pn + 4);
  auStack_150 = *(uint32_t (*) [2])((issue->account).pn + 1);
  local_148 = *(uint32_t (*) [2])((issue->account).pn + 3);
  local_140 = 0;
  local_138 = 0;
  local_133 = false;
  STAmount::canonicalize((STAmount *)local_178);
  if (local_168._M_allocated_capacity._0_4_ == 0) {
    lVar16 = 5;
    do {
      lVar15 = lVar16;
      if (lVar15 == 9) goto LAB_001b02d3;
      lVar16 = lVar15 + 1;
    } while (*(int *)(local_178 + lVar15 * 4) == 0);
    if (3 < lVar15 - 5U) {
LAB_001b02d3:
      pvVar10 = boost::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[](&local_e8,3);
      if (pvVar10->matched == true) {
        Throw<std::runtime_error,char_const(&)[41]>
                  ((char (*) [41])"XRP must be specified in integral drops.");
      }
    }
  }
  pvVar10 = boost::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&local_e8,4);
  if (pvVar10->matched == false) {
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,2);
    paVar12 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar12;
    if (pvVar10->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_130,
                 (pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
    }
    uVar11 = beast::lexicalCastThrow<unsigned_long,std::__cxx11::string>(&local_130);
    iVar8 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar12) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,2);
    m2 = boost::
         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator[](&local_e8,4);
    boost::operator+(&local_50,pvVar10,m2);
    uVar11 = beast::lexicalCastThrow<unsigned_long,std::__cxx11::string>(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,4);
    iVar8 = 0;
    if (pvVar10->matched != false) {
      iVar8 = *(int *)&(pvVar10->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current -
              *(int *)&(pvVar10->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current;
    }
  }
  pvVar10 = boost::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&local_e8,5);
  if (pvVar10->matched != true) goto LAB_001b051c;
  pvVar10 = boost::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&local_e8,6);
  if (pvVar10->matched == true) {
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,6);
    boost::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,pvVar10);
    local_110 = uVar11;
    iVar9 = std::__cxx11::string::compare(local_178);
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_168._M_allocated_capacity + 1);
    }
    uVar11 = local_110;
    if (iVar9 != 0) goto LAB_001b049f;
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,7);
    if (pvVar10->matched == true) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_70,
                 (pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
    }
    iVar9 = beast::lexicalCastThrow<int,std::__cxx11::string>(&local_70);
    iVar9 = -iVar9;
    pbVar6 = &local_70;
  }
  else {
LAB_001b049f:
    pvVar10 = boost::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&local_e8,7);
    if (pvVar10->matched == true) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_90,
                 (pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (pvVar10->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
    }
    iVar9 = beast::lexicalCastThrow<int,std::__cxx11::string>(&local_90);
    pbVar6 = &local_90;
  }
  paVar12 = &pbVar6->field_2;
  iVar8 = iVar8 + iVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar12->_M_allocated_capacity)[-2] != paVar12) {
    operator_delete((undefined1 *)(&paVar12->_M_allocated_capacity)[-2],
                    paVar12->_M_allocated_capacity + 1);
  }
LAB_001b051c:
  (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
  (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d2fc0;
  uVar3 = *(undefined8 *)((issue->currency).pn + 2);
  uVar4 = *(undefined8 *)((issue->currency).pn + 4);
  uVar5 = *(undefined8 *)((issue->account).pn + 1);
  *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn = *(undefined8 *)(issue->currency).pn;
  *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar3;
  *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = uVar4;
  *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar5;
  *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
       *(undefined8 *)((issue->account).pn + 3);
  __return_storage_ptr__->mValue = uVar11;
  __return_storage_ptr__->mOffset = iVar8;
  __return_storage_ptr__->mIsNegative = bVar7;
  STAmount::canonicalize(__return_storage_ptr__);
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

STAmount
amountFromString (Issue const& issue, std::string const& amount)
{
    static boost::regex const reNumber (
        "^"                       // the beginning of the string
        "([-+]?)"                 // (optional) + or - character
        "(0|[1-9][0-9]*)"         // a number (no leading zeroes, unless 0)
        "(\\.([0-9]+))?"          // (optional) period followed by any number
        "([eE]([+-]?)([0-9]+))?"  // (optional) E, optional + or -, any number
        "$",
        boost::regex_constants::optimize);

    boost::smatch match;

    if (!boost::regex_match (amount, match, reNumber))
        Throw<std::runtime_error> ("Number '" + amount + "' is not valid");

    // Match fields:
    //   0 = whole input
    //   1 = sign
    //   2 = integer portion
    //   3 = whole fraction (with '.')
    //   4 = fraction (without '.')
    //   5 = whole exponent (with 'e')
    //   6 = exponent sign
    //   7 = exponent number

    // CHECKME: Why 32? Shouldn't this be 16?
    if ((match[2].length () + match[4].length ()) > 32)
        Throw<std::runtime_error> ("Number '" + amount + "' is overlong");

    bool negative = (match[1].matched && (match[1] == "-"));

    // Can't specify XRP using fractional representation
    if (isXRP(issue) && match[3].matched)
        Throw<std::runtime_error> ("XRP must be specified in integral drops.");

    std::uint64_t mantissa;
    int exponent;

    if (!match[4].matched) // integer only
    {
        mantissa = beast::lexicalCastThrow <std::uint64_t> (std::string (match[2]));
        exponent = 0;
    }
    else
    {
        // integer and fraction
        mantissa = beast::lexicalCastThrow <std::uint64_t> (match[2] + match[4]);
        exponent = -(match[4].length ());
    }

    if (match[5].matched)
    {
        // we have an exponent
        if (match[6].matched && (match[6] == "-"))
            exponent -= beast::lexicalCastThrow <int> (std::string (match[7]));
        else
            exponent += beast::lexicalCastThrow <int> (std::string (match[7]));
    }

    return { issue, mantissa, exponent, negative };
}